

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

QList<QPointer<QWidget>_> * __thiscall
QMenuPrivate::calcCausedStack(QList<QPointer<QWidget>_> *__return_storage_ptr__,QMenuPrivate *this)

{
  QPointer<QWidget> *b;
  long lVar1;
  long lVar2;
  Data *pDVar3;
  QObject *pQVar4;
  long in_FS_OFFSET;
  QPointer<QWidget> local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QPointer<QWidget> *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pDVar3 = (this->causedPopup).widget.wp.d;
  if (((pDVar3 != (Data *)0x0) && (*(int *)(pDVar3 + 4) != 0)) &&
     (pQVar4 = (this->causedPopup).widget.wp.value, pQVar4 != (QObject *)0x0)) {
    while( true ) {
      local_40.wp.d = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(pQVar4);
      local_40.wp.value = pQVar4;
      QtPrivate::QMovableArrayOps<QPointer<QWidget>>::emplace<QPointer<QWidget>>
                ((QMovableArrayOps<QPointer<QWidget>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_40);
      QList<QPointer<QWidget>_>::end(__return_storage_ptr__);
      if (local_40.wp.d != (Data *)0x0) {
        LOCK();
        *(int *)local_40.wp.d = *(int *)local_40.wp.d + -1;
        UNLOCK();
        if (*(int *)local_40.wp.d == 0) {
          pDVar3 = local_40.wp.d;
          if (local_40.wp.d == (Data *)0x0) {
            pDVar3 = (Data *)0x0;
          }
          operator_delete(pDVar3);
        }
      }
      lVar2 = QMetaObject::cast((QObject *)&QTornOffMenu::staticMetaObject);
      if (lVar2 != 0) {
        b = *(QPointer<QWidget> **)(*(long *)(lVar2 + 8) + 0x440);
        QtPrivate::QCommonArrayOps<QPointer<QWidget>_>::growAppend
                  ((QCommonArrayOps<QPointer<QWidget>_> *)__return_storage_ptr__,b,
                   b + *(long *)(*(long *)(lVar2 + 8) + 0x448));
      }
      lVar2 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      if (lVar2 == 0) break;
      lVar1 = *(long *)(*(long *)(lVar2 + 8) + 0x2f8);
      if (((lVar1 == 0) || (*(int *)(lVar1 + 4) == 0)) ||
         (pQVar4 = *(QObject **)(*(long *)(lVar2 + 8) + 0x300), pQVar4 == (QObject *)0x0)) break;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QPointer<QWidget>> QMenuPrivate::calcCausedStack() const
{
    QList<QPointer<QWidget>> ret;
    for(QWidget *widget = causedPopup.widget; widget; ) {
        ret.append(widget);
        if (QTornOffMenu *qtmenu = qobject_cast<QTornOffMenu*>(widget))
            ret += qtmenu->d_func()->causedStack;
        if (QMenu *qmenu = qobject_cast<QMenu*>(widget))
            widget = qmenu->d_func()->causedPopup.widget;
        else
            break;
    }
    return ret;
}